

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O0

void ExchCXX::detail::host_eval_exc_inc_helper_polar<ExchCXX::BuiltinPZ81>
               (double scal_fact,int N,const_host_buffer_type rho,host_buffer_type eps)

{
  double in_RDX;
  long in_RSI;
  int in_EDI;
  double in_XMM0_Qa;
  double e;
  const_host_buffer_type rho_i;
  int32_t i;
  undefined8 local_38;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar1;
  
  for (iVar1 = 0; iVar1 < in_EDI; iVar1 = iVar1 + 1) {
    lda_screening_interface<ExchCXX::BuiltinPZ81>::eval_exc_polar
              (in_RDX,(double)CONCAT44(iVar1,in_stack_ffffffffffffffd8),
               (double *)(in_RSI + (long)(iVar1 << 1) * 8));
    *(double *)((long)in_RDX + (long)iVar1 * 8) =
         in_XMM0_Qa * local_38 + *(double *)((long)in_RDX + (long)iVar1 * 8);
  }
  return;
}

Assistant:

LDA_EXC_INC_GENERATOR( host_eval_exc_inc_helper_polar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    auto rho_i = rho + 2*i;

    double e;
    traits::eval_exc_polar( rho_i[0], rho_i[1], e );
    
    eps[i] += scal_fact * e;

  }

}